

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

bool __thiscall cmQtAutoGenInitializer::InitCustomTargets(cmQtAutoGenInitializer *this)

{
  cmMakefile *this_00;
  cmGeneratorTarget *pcVar1;
  pointer pbVar2;
  key_type *pkVar3;
  anon_struct_424_12_03782e7a_for_AutogenTarget *paVar4;
  anon_struct_424_12_03782e7a_for_AutogenTarget *paVar5;
  ulong __val;
  undefined8 uVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  PolicyStatus PVar10;
  uint uVar11;
  cmLocalGenerator *pcVar12;
  cmState *pcVar13;
  string *psVar14;
  char *pcVar15;
  string *psVar16;
  mapped_type *pmVar17;
  char *pcVar18;
  ulong uVar19;
  char cVar20;
  string *cfg_1;
  key_type *__k;
  cmQtAutoGenInitializer *pcVar21;
  string *cfg;
  pointer __k_00;
  unsigned_long iVerb;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraDeps;
  cmTarget *depTarget;
  undefined1 local_98 [32];
  string *local_78;
  cmMakefile *local_70;
  undefined1 local_68 [32];
  cmQtAutoGenInitializer *local_48;
  string *local_40;
  _Alloc_hider local_38;
  
  this_00 = this->Target->Target->Makefile;
  pcVar12 = cmGeneratorTarget::GetLocalGenerator(this->Target);
  iVar9 = (*pcVar12->GlobalGenerator->_vptr_cmGlobalGenerator[0x23])();
  this->MultiConfig = SUB41(iVar9,0);
  local_70 = this_00;
  cmMakefile::GetConfigurations((string *)local_98,this_00,&this->ConfigsList,true);
  std::__cxx11::string::operator=((string *)&this->ConfigDefault,(string *)local_98);
  if ((SystemInformationImplementation *)local_98._0_8_ !=
      (SystemInformationImplementation *)(local_98 + 0x10)) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  if ((this->ConfigsList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->ConfigsList).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->ConfigsList,&this->ConfigDefault);
  }
  local_98._0_8_ = local_98 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"CMAKE_AUTOGEN_VERBOSE","");
  cmMakefile::GetSafeDefinition(local_70,(string *)local_98);
  psVar14 = &this->Verbosity;
  std::__cxx11::string::_M_assign((string *)psVar14);
  if ((SystemInformationImplementation *)local_98._0_8_ !=
      (SystemInformationImplementation *)(local_98 + 0x10)) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  if ((this->Verbosity)._M_string_length != 0) {
    local_98._0_8_ = (SystemInformationImplementation *)0x0;
    bVar8 = cmSystemTools::StringToULong((psVar14->_M_dataplus)._M_p,(unsigned_long *)local_98);
    if (!bVar8) {
      bVar8 = cmSystemTools::IsOn(psVar14);
      pcVar18 = "0";
      if (bVar8) {
        pcVar18 = "1";
      }
      std::__cxx11::string::_M_replace
                ((ulong)psVar14,0,(char *)(this->Verbosity)._M_string_length,(ulong)pcVar18);
    }
  }
  pcVar13 = cmMakefile::GetState(local_70);
  local_98._0_8_ = local_98 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"AUTOMOC_TARGETS_FOLDER","");
  pcVar18 = cmState::GetGlobalProperty(pcVar13,(string *)local_98);
  if ((SystemInformationImplementation *)local_98._0_8_ !=
      (SystemInformationImplementation *)(local_98 + 0x10)) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  if (pcVar18 == (char *)0x0) {
    pcVar13 = cmMakefile::GetState(local_70);
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"AUTOGEN_TARGETS_FOLDER","");
    pcVar18 = cmState::GetGlobalProperty(pcVar13,(string *)local_98);
    if ((SystemInformationImplementation *)local_98._0_8_ !=
        (SystemInformationImplementation *)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
  }
  if (pcVar18 == (char *)0x0) {
    pcVar1 = this->Target;
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"FOLDER","");
    pcVar18 = cmGeneratorTarget::GetProperty(pcVar1,(string *)local_98);
    if ((SystemInformationImplementation *)local_98._0_8_ !=
        (SystemInformationImplementation *)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
  }
  if (pcVar18 != (char *)0x0) {
    pcVar15 = (char *)(this->TargetsFolder)._M_string_length;
    strlen(pcVar18);
    std::__cxx11::string::_M_replace((ulong)&this->TargetsFolder,0,pcVar15,(ulong)pcVar18);
  }
  PVar10 = cmMakefile::GetPolicyStatus(local_70,CMP0071,false);
  if (PVar10 - NEW < 3) {
    this->CMP0071Accept = true;
  }
  else if (PVar10 == WARN) {
    this->CMP0071Warn = true;
  }
  local_68._0_8_ = local_68 + 0x10;
  local_68._8_8_ = (string *)0x0;
  local_68._16_8_ = local_68._16_8_ & 0xffffffffffffff00;
  psVar14 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(local_70);
  cmsys::SystemTools::CollapseFullPath((string *)local_98,(string *)local_68,psVar14);
  if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  local_78 = &(this->Dir).Info;
  std::__cxx11::string::_M_assign((string *)local_78);
  std::__cxx11::string::append((char *)local_78);
  std::__cxx11::string::push_back((char)local_78);
  psVar14 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  std::__cxx11::string::_M_append((char *)local_78,(ulong)(psVar14->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)local_78);
  std::__cxx11::string::append((char *)local_78);
  cmsys::SystemTools::ConvertToUnixSlashes(local_78);
  pcVar1 = this->Target;
  local_68._0_8_ = local_68 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"AUTOGEN_BUILD_DIR","");
  pcVar15 = cmGeneratorTarget::GetSafeProperty(pcVar1,(string *)local_68);
  psVar14 = &(this->Dir).Build;
  pcVar18 = (char *)(this->Dir).Build._M_string_length;
  strlen(pcVar15);
  std::__cxx11::string::_M_replace((ulong)psVar14,0,pcVar18,(ulong)pcVar15);
  if ((string *)local_68._0_8_ != (string *)(local_68 + 0x10)) {
    operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
  }
  if ((this->Dir).Build._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)psVar14);
    std::__cxx11::string::push_back((char)psVar14);
    psVar16 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
    std::__cxx11::string::_M_append((char *)psVar14,(ulong)(psVar16->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)psVar14);
  }
  cmsys::SystemTools::ConvertToUnixSlashes(psVar14);
  AddCleanFile(local_70,psVar14);
  psVar14 = &(this->Dir).Work;
  std::__cxx11::string::_M_assign((string *)psVar14);
  cmsys::SystemTools::ConvertToUnixSlashes(psVar14);
  local_40 = &(this->Dir).Include;
  std::__cxx11::string::_M_assign((string *)local_40);
  std::__cxx11::string::append((char *)local_40);
  if (this->MultiConfig == true) {
    std::__cxx11::string::append((char *)local_40);
  }
  local_48 = this;
  if (this->MultiConfig == true) {
    __k_00 = (this->ConfigsList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar2 = (this->ConfigsList).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (__k_00 != pbVar2) {
      do {
        pmVar17 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&(this->Dir).ConfigInclude,__k_00);
        std::__cxx11::string::_M_assign((string *)pmVar17);
        std::__cxx11::string::append((char *)pmVar17);
        std::__cxx11::string::_M_append((char *)pmVar17,(ulong)(__k_00->_M_dataplus)._M_p);
        __k_00 = __k_00 + 1;
      } while (__k_00 != pbVar2);
    }
  }
  if ((SystemInformationImplementation *)local_98._0_8_ !=
      (SystemInformationImplementation *)(local_98 + 0x10)) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  pcVar21 = local_48;
  bVar8 = (local_48->Moc).super_GenVarsT.Enabled;
  if ((bVar8 != false) || (((local_48->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
    if ((bVar8 != false) && (bVar8 = InitMoc(local_48), !bVar8)) {
      return false;
    }
    if (((pcVar21->Uic).super_GenVarsT.Enabled == true) && (bVar8 = InitUic(pcVar21), !bVar8)) {
      return false;
    }
    cmGeneratorTarget::GetName_abi_cxx11_(pcVar21->Target);
    std::__cxx11::string::_M_assign((string *)&pcVar21->AutogenTarget);
    std::__cxx11::string::append((char *)&pcVar21->AutogenTarget);
    pcVar1 = pcVar21->Target;
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"AUTOGEN_PARALLEL","");
    pcVar15 = cmGeneratorTarget::GetSafeProperty(pcVar1,(string *)local_98);
    psVar14 = &(pcVar21->AutogenTarget).Parallel;
    pcVar18 = (char *)(pcVar21->AutogenTarget).Parallel._M_string_length;
    strlen(pcVar15);
    std::__cxx11::string::_M_replace((ulong)psVar14,0,pcVar18,(ulong)pcVar15);
    if ((SystemInformationImplementation *)local_98._0_8_ !=
        (SystemInformationImplementation *)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
    if (((pcVar21->AutogenTarget).Parallel._M_string_length == 0) ||
       (iVar9 = std::__cxx11::string::compare((char *)psVar14), iVar9 == 0)) {
      if (GetParallelCPUCount()::count == 0) {
        cmsys::SystemInformation::SystemInformation((SystemInformation *)local_98);
        cmsys::SystemInformation::RunCPUCheck((SystemInformation *)local_98);
        uVar11 = cmsys::SystemInformation::GetNumberOfPhysicalCPU((SystemInformation *)local_98);
        uVar11 = uVar11 + (uVar11 == 0);
        if (0x40 < uVar11) {
          uVar11 = 0x40;
        }
        GetParallelCPUCount()::count = (ulong)uVar11;
        cmsys::SystemInformation::~SystemInformation((SystemInformation *)local_98);
      }
      __val = GetParallelCPUCount()::count;
      cVar20 = '\x01';
      if (9 < GetParallelCPUCount()::count) {
        uVar19 = GetParallelCPUCount()::count;
        cVar7 = '\x04';
        do {
          cVar20 = cVar7;
          if (uVar19 < 100) {
            cVar20 = cVar20 + -2;
            goto LAB_001d9eab;
          }
          if (uVar19 < 1000) {
            cVar20 = cVar20 + -1;
            goto LAB_001d9eab;
          }
          if (uVar19 < 10000) goto LAB_001d9eab;
          bVar8 = 99999 < uVar19;
          uVar19 = uVar19 / 10000;
          cVar7 = cVar20 + '\x04';
        } while (bVar8);
        cVar20 = cVar20 + '\x01';
      }
LAB_001d9eab:
      local_98._0_8_ = (SystemInformationImplementation *)(local_98 + 0x10);
      std::__cxx11::string::_M_construct((ulong)local_98,cVar20);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_98._0_8_,local_98._8_4_,__val);
      std::__cxx11::string::operator=((string *)psVar14,(string *)local_98);
      if ((SystemInformationImplementation *)local_98._0_8_ !=
          (SystemInformationImplementation *)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
      }
    }
    psVar14 = &(pcVar21->AutogenTarget).InfoFile;
    std::__cxx11::string::_M_assign((string *)psVar14);
    std::__cxx11::string::append((char *)psVar14);
    psVar14 = &(pcVar21->AutogenTarget).SettingsFile;
    std::__cxx11::string::_M_assign((string *)psVar14);
    std::__cxx11::string::append((char *)psVar14);
    if (pcVar21->MultiConfig == true) {
      __k = (pcVar21->ConfigsList).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      pkVar3 = (pcVar21->ConfigsList).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__k != pkVar3) {
        local_78 = (string *)&(local_48->AutogenTarget).ConfigSettingsFile;
        do {
          pmVar17 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_78,__k);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_68,"_",__k);
          cmQtAutoGen::AppendFilenameSuffix
                    ((string *)local_98,psVar14,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
          std::__cxx11::string::operator=((string *)pmVar17,(string *)local_98);
          if ((SystemInformationImplementation *)local_98._0_8_ !=
              (SystemInformationImplementation *)(local_98 + 0x10)) {
            operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
          }
          if ((string *)local_68._0_8_ != (string *)(local_68 + 0x10)) {
            operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
          }
          AddCleanFile(local_70,pmVar17);
          __k = __k + 1;
        } while (__k != pkVar3);
      }
    }
    else {
      AddCleanFile(local_70,psVar14);
    }
    pcVar21 = local_48;
    pcVar1 = local_48->Target;
    local_98._0_8_ = local_98 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"AUTOGEN_ORIGIN_DEPENDS","");
    bVar8 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,(string *)local_98);
    (pcVar21->AutogenTarget).DependOrigin = bVar8;
    if ((SystemInformationImplementation *)local_98._0_8_ !=
        (SystemInformationImplementation *)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
    pcVar1 = pcVar21->Target;
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"AUTOGEN_TARGET_DEPENDS","");
    pcVar18 = cmGeneratorTarget::GetSafeProperty(pcVar1,(string *)local_68);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_98,pcVar18,(allocator<char> *)&local_38);
    if ((string *)local_68._0_8_ != (string *)(local_68 + 0x10)) {
      operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
    }
    if (CONCAT44(local_98._12_4_,local_98._8_4_) != 0) {
      local_68._0_8_ = (string *)0x0;
      local_68._8_8_ = (string *)0x0;
      local_68._16_8_ = 0;
      cmSystemTools::ExpandListArgument
                ((string *)local_98,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_68,false);
      uVar6 = local_68._8_8_;
      if (local_68._0_8_ != local_68._8_8_) {
        paVar4 = &local_48->AutogenTarget;
        paVar5 = &local_48->AutogenTarget;
        psVar14 = (string *)local_68._0_8_;
        do {
          local_38._M_p = &cmMakefile::FindTargetToUse(local_70,psVar14,false)->IsGeneratorProvided;
          if ((cmTarget *)local_38._M_p == (cmTarget *)0x0) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&paVar5->DependFiles,psVar14);
          }
          else {
            std::
            _Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
            ::_M_insert_unique<cmTarget*const&>
                      ((_Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
                        *)&paVar4->DependTargets,(cmTarget **)&local_38);
          }
          psVar14 = psVar14 + 1;
        } while (psVar14 != (string *)uVar6);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_68);
      pcVar21 = local_48;
    }
    if ((SystemInformationImplementation *)local_98._0_8_ !=
        (SystemInformationImplementation *)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
    }
  }
  if (((pcVar21->Rcc).super_GenVarsT.Enabled != true) || (bVar8 = InitRcc(pcVar21), bVar8)) {
    if ((((pcVar21->Moc).super_GenVarsT.Enabled != false) ||
        (((pcVar21->Uic).super_GenVarsT.Enabled & 1U) != 0)) ||
       (((pcVar21->Rcc).super_GenVarsT.Enabled == true && (pcVar21->MultiConfig == true)))) {
      cmGeneratorTarget::AddIncludeDirectory(pcVar21->Target,local_40,true);
    }
    bVar8 = InitScanFiles(pcVar21);
    if (bVar8) {
      if (((pcVar21->Moc).super_GenVarsT.Enabled != false) ||
         (((pcVar21->Uic).super_GenVarsT.Enabled & 1U) != 0)) {
        InitAutogenTarget(pcVar21);
      }
      if ((pcVar21->Rcc).super_GenVarsT.Enabled == true) {
        InitRccTargets(pcVar21);
        return true;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool cmQtAutoGenInitializer::InitCustomTargets()
{
  cmMakefile* makefile = this->Target->Target->GetMakefile();
  cmLocalGenerator* localGen = this->Target->GetLocalGenerator();
  cmGlobalGenerator* globalGen = localGen->GetGlobalGenerator();

  // Configurations
  this->MultiConfig = globalGen->IsMultiConfig();
  this->ConfigDefault = makefile->GetConfigurations(this->ConfigsList);
  if (this->ConfigsList.empty()) {
    this->ConfigsList.push_back(this->ConfigDefault);
  }

  // Verbosity
  this->Verbosity = makefile->GetSafeDefinition("CMAKE_AUTOGEN_VERBOSE");
  if (!this->Verbosity.empty()) {
    unsigned long iVerb = 0;
    if (!cmSystemTools::StringToULong(this->Verbosity.c_str(), &iVerb)) {
      // Non numeric verbosity
      this->Verbosity = cmSystemTools::IsOn(this->Verbosity) ? "1" : "0";
    }
  }

  // Targets FOLDER
  {
    const char* folder =
      makefile->GetState()->GetGlobalProperty("AUTOMOC_TARGETS_FOLDER");
    if (folder == nullptr) {
      folder =
        makefile->GetState()->GetGlobalProperty("AUTOGEN_TARGETS_FOLDER");
    }
    // Inherit FOLDER property from target (#13688)
    if (folder == nullptr) {
      folder = this->Target->GetProperty("FOLDER");
    }
    if (folder != nullptr) {
      this->TargetsFolder = folder;
    }
  }

  // Check status of policy CMP0071
  {
    cmPolicies::PolicyStatus const CMP0071_status =
      makefile->GetPolicyStatus(cmPolicies::CMP0071);
    switch (CMP0071_status) {
      case cmPolicies::WARN:
        this->CMP0071Warn = true;
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // Ignore GENERATED file
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        // Process GENERATED file
        this->CMP0071Accept = true;
        break;
    }
  }

  // Common directories
  {
    // Collapsed current binary directory
    std::string const cbd = cmSystemTools::CollapseFullPath(
      std::string(), makefile->GetCurrentBinaryDirectory());

    // Info directory
    this->Dir.Info = cbd;
    this->Dir.Info += "/CMakeFiles";
    this->Dir.Info += '/';
    this->Dir.Info += this->Target->GetName();
    this->Dir.Info += "_autogen";
    this->Dir.Info += ".dir";
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Info);

    // Build directory
    this->Dir.Build = this->Target->GetSafeProperty("AUTOGEN_BUILD_DIR");
    if (this->Dir.Build.empty()) {
      this->Dir.Build = cbd;
      this->Dir.Build += '/';
      this->Dir.Build += this->Target->GetName();
      this->Dir.Build += "_autogen";
    }
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Build);
    // Cleanup build directory
    AddCleanFile(makefile, this->Dir.Build);

    // Working directory
    this->Dir.Work = cbd;
    cmSystemTools::ConvertToUnixSlashes(this->Dir.Work);

    // Include directory
    this->Dir.Include = this->Dir.Build;
    this->Dir.Include += "/include";
    if (this->MultiConfig) {
      this->Dir.Include += "_$<CONFIG>";
    }
    // Per config include directories
    if (this->MultiConfig) {
      for (std::string const& cfg : this->ConfigsList) {
        std::string& dir = this->Dir.ConfigInclude[cfg];
        dir = this->Dir.Build;
        dir += "/include_";
        dir += cfg;
      }
    }
  }

  // Moc, Uic and _autogen target settings
  if (this->MocOrUicEnabled()) {
    // Init moc specific settings
    if (this->Moc.Enabled && !InitMoc()) {
      return false;
    }

    // Init uic specific settings
    if (this->Uic.Enabled && !InitUic()) {
      return false;
    }

    // Autogen target name
    this->AutogenTarget.Name = this->Target->GetName();
    this->AutogenTarget.Name += "_autogen";

    // Autogen target parallel processing
    this->AutogenTarget.Parallel =
      this->Target->GetSafeProperty("AUTOGEN_PARALLEL");
    if (this->AutogenTarget.Parallel.empty() ||
        (this->AutogenTarget.Parallel == "AUTO")) {
      // Autodetect number of CPUs
      this->AutogenTarget.Parallel = std::to_string(GetParallelCPUCount());
    }

    // Autogen target info and settings files
    {
      this->AutogenTarget.InfoFile = this->Dir.Info;
      this->AutogenTarget.InfoFile += "/AutogenInfo.cmake";

      this->AutogenTarget.SettingsFile = this->Dir.Info;
      this->AutogenTarget.SettingsFile += "/AutogenOldSettings.txt";

      if (this->MultiConfig) {
        for (std::string const& cfg : this->ConfigsList) {
          std::string& filename = this->AutogenTarget.ConfigSettingsFile[cfg];
          filename =
            AppendFilenameSuffix(this->AutogenTarget.SettingsFile, "_" + cfg);
          AddCleanFile(makefile, filename);
        }
      } else {
        AddCleanFile(makefile, this->AutogenTarget.SettingsFile);
      }
    }

    // Autogen target: Compute user defined dependencies
    {
      this->AutogenTarget.DependOrigin =
        this->Target->GetPropertyAsBool("AUTOGEN_ORIGIN_DEPENDS");

      std::string const deps =
        this->Target->GetSafeProperty("AUTOGEN_TARGET_DEPENDS");
      if (!deps.empty()) {
        std::vector<std::string> extraDeps;
        cmSystemTools::ExpandListArgument(deps, extraDeps);
        for (std::string const& depName : extraDeps) {
          // Allow target and file dependencies
          auto* depTarget = makefile->FindTargetToUse(depName);
          if (depTarget != nullptr) {
            this->AutogenTarget.DependTargets.insert(depTarget);
          } else {
            this->AutogenTarget.DependFiles.insert(depName);
          }
        }
      }
    }
  }

  // Init rcc specific settings
  if (this->Rcc.Enabled && !InitRcc()) {
    return false;
  }

  // Add autogen include directory to the origin target INCLUDE_DIRECTORIES
  if (this->MocOrUicEnabled() || (this->Rcc.Enabled && this->MultiConfig)) {
    this->Target->AddIncludeDirectory(this->Dir.Include, true);
  }

  // Scan files
  if (!this->InitScanFiles()) {
    return false;
  }

  // Create autogen target
  if (this->MocOrUicEnabled() && !this->InitAutogenTarget()) {
    return false;
  }

  // Create rcc targets
  if (this->Rcc.Enabled && !this->InitRccTargets()) {
    return false;
  }

  return true;
}